

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# containers.h
# Opt level: O1

size_t __thiscall
pbrt::
HashMap<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<int>,_pstd::pmr::polymorphic_allocator<pstd::optional<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
::FindOffset(HashMap<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<int>,_pstd::pmr::polymorphic_allocator<pstd::optional<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
             *this,int *key)

{
  optional<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *poVar1;
  ulong in_RAX;
  ulong uVar2;
  int nProbes;
  uint uVar3;
  ulong uVar4;
  bool bVar5;
  
  poVar1 = (this->table).ptr;
  uVar2 = (this->table).nStored - 1;
  uVar3 = 0;
  do {
    uVar4 = (ulong)(uVar3 * uVar3 >> 1) + (ulong)(uVar3 >> 1) + ((long)*key & uVar2) & uVar2;
    if (poVar1[uVar4].set == true) {
      bVar5 = *key != *(int *)&poVar1[uVar4].optionalValue;
      if (!bVar5) {
        in_RAX = uVar4;
      }
    }
    else {
      bVar5 = false;
      in_RAX = uVar4;
    }
    uVar3 = uVar3 + 1;
  } while (bVar5);
  return in_RAX;
}

Assistant:

PBRT_CPU_GPU
    size_t FindOffset(const Key &key) const {
        size_t baseOffset = Hash()(key) & (capacity() - 1);
        for (int nProbes = 0;; ++nProbes) {
            // Find offset for _key_ using quadratic probing
            size_t offset =
                (baseOffset + nProbes / 2 + nProbes * nProbes / 2) & (capacity() - 1);
            if (table[offset].has_value() == false || key == table[offset]->first)
                return offset;
        }
    }